

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logger.cpp
# Opt level: O0

LoggerInstance * gnilk::Logger::GetInstance(string *name)

{
  bool bVar1;
  Logger *this;
  string *this_00;
  mapped_type *ppLVar2;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_gnilk::LoggerInstance_*>
  local_70;
  string *local_48;
  LoggerInstance *pInstance;
  Logger *local_30;
  ILogger *pLogger;
  _Self local_20;
  string *local_18;
  string *name_local;
  
  local_18 = name;
  local_20._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_gnilk::LoggerInstance_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_gnilk::LoggerInstance_*>_>_>
       ::find(&loggers_abi_cxx11_,name);
  pLogger = (ILogger *)
            std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_gnilk::LoggerInstance_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_gnilk::LoggerInstance_*>_>_>
            ::end(&loggers_abi_cxx11_);
  bVar1 = std::operator==(&local_20,(_Self *)&pLogger);
  if (bVar1) {
    this = (Logger *)operator_new(0x30);
    Logger(this,local_18);
    local_30 = this;
    this_00 = (string *)operator_new(0x10);
    LoggerInstance::LoggerInstance((LoggerInstance *)this_00,&local_30->super_ILogger);
    local_48 = this_00;
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_gnilk::LoggerInstance_*>
    ::pair<gnilk::LoggerInstance_*&,_true>(&local_70,local_18,(LoggerInstance **)&local_48);
    std::
    map<std::__cxx11::string,gnilk::LoggerInstance*,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,gnilk::LoggerInstance*>>>
    ::insert<std::pair<std::__cxx11::string,gnilk::LoggerInstance*>>
              ((map<std::__cxx11::string,gnilk::LoggerInstance*,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,gnilk::LoggerInstance*>>>
                *)&loggers_abi_cxx11_,&local_70);
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_gnilk::LoggerInstance_*>
    ::~pair(&local_70);
    name_local = local_48;
  }
  else {
    ppLVar2 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_gnilk::LoggerInstance_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_gnilk::LoggerInstance_*>_>_>
              ::operator[](&loggers_abi_cxx11_,local_18);
    name_local = (string *)*ppLVar2;
  }
  return (LoggerInstance *)name_local;
}

Assistant:

LoggerInstance *Logger::GetInstance(const std::string &name) {

    // We need a maximum
	if (loggers.find(name) == loggers.end()) {
		// Have to create logger
		ILogger *pLogger = (ILogger *)new Logger(name);
		LoggerInstance *pInstance = new LoggerInstance(pLogger);
		// TODO: Support for exclude list		
		loggers.insert(std::pair<std::string, LoggerInstance *>(name, pInstance));

		return pInstance;
	}
	return loggers[name];
}